

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Array<kj::ArrayPtr<unsigned_char_const>const>>
          (Promise<void> *this,Array<const_kj::ArrayPtr<const_unsigned_char>_> *attachments)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  PromiseNode *pPVar3;
  long *in_RDX;
  Array<const_kj::ArrayPtr<const_unsigned_char>_> local_38;
  PromiseNode *local_20;
  
  local_38.ptr = (ArrayPtr<const_unsigned_char> *)*in_RDX;
  local_38.size_ = in_RDX[1];
  local_38.disposer = (ArrayDisposer *)in_RDX[2];
  *in_RDX = 0;
  in_RDX[1] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Array<kj::ArrayPtr<unsigned_char_const>const>>,kj::_::PromiseDisposer,kj::Array<kj::ArrayPtr<unsigned_char_const>const>>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)attachments,&local_38);
  pPVar3 = local_20;
  sVar2 = local_38.size_;
  pAVar1 = local_38.ptr;
  local_20 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar3;
  if (local_38.ptr != (ArrayPtr<const_unsigned_char> *)0x0) {
    local_38.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    local_38.size_ = 0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)(local_38.disposer,pAVar1,0x10,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}